

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O3

QByteArray *
QRestReplyPrivate::contentCharset(QByteArray *__return_storage_ptr__,QNetworkReply *reply)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  QByteArrayView data;
  QByteArrayView data_00;
  QByteArrayView data_01;
  qsizetype qVar2;
  qsizetype qVar3;
  storage_type *psVar4;
  char __c;
  int iVar5;
  storage_type *psVar6;
  char *pcVar7;
  undefined1 *__n2;
  undefined1 *puVar8;
  undefined1 *puVar9;
  long in_FS_OFFSET;
  QLatin1String QVar10;
  QByteArrayView QVar11;
  QLatin1String QVar12;
  R_conflict4 r;
  char *local_148;
  undefined1 *local_140;
  QByteArray local_138;
  R_conflict7 local_118;
  R_conflict7 local_f8;
  QByteArrayView local_d8;
  R_conflict7 local_c8;
  R_conflict7 local_a8;
  QByteArrayView local_88;
  undefined1 *local_78;
  storage_type *psStack_70;
  undefined1 *local_68;
  storage_type *psStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkReply::headers((QNetworkReply *)&local_78);
  QVar11 = QHttpHeaders::value((QHttpHeaders *)&local_78,ContentType,(QByteArrayView)ZEXT816(0));
  QByteArray::QByteArray(&local_138,QVar11.m_data,QVar11.m_size);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_78);
  local_58.field_2._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._M_dataplus._M_p = &DAT_aaaaaaaaaaaaaaaa;
  local_58._M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  psStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  psStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8.m_size = local_138.d.size;
  local_d8.m_data = local_138.d.ptr;
  eat_CWS(&local_d8);
  local_f8.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_f8.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
  QVar11.m_data = local_d8.m_data;
  QVar11.m_size = local_d8.m_size;
  parse_token(&local_f8,QVar11);
  qVar3 = local_f8.token.m_size;
  if ((undefined1 *)local_f8.token.m_size == (undefined1 *)0x0) {
LAB_002214aa:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_68 = (undefined1 *)0x0;
    psStack_60 = (storage_type *)0x0;
    local_78 = (undefined1 *)0x0;
    psStack_70 = (storage_type *)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity =
         local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  }
  else {
    local_d8.m_size = local_f8.tail.m_size;
    local_d8.m_data = local_f8.tail.m_data;
    eat_CWS(&local_d8);
    if (((undefined1 *)local_d8.m_size == (undefined1 *)0x0) || (*local_d8.m_data != '/'))
    goto LAB_002214aa;
    local_d8.m_data = local_d8.m_data + 1;
    local_d8.m_size = local_d8.m_size + -1;
    eat_CWS(&local_d8);
    local_118.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_118.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
    local_118.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_118.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
    data.m_data = local_d8.m_data;
    data.m_size = local_d8.m_size;
    parse_token(&local_118,data);
    qVar2 = local_118.token.m_size;
    paVar1 = &local_58.field_2;
    if ((undefined1 *)local_118.token.m_size == (undefined1 *)0x0) {
      local_68 = (undefined1 *)0x0;
      psStack_60 = (storage_type *)0x0;
      local_78 = (undefined1 *)0x0;
      psStack_70 = (storage_type *)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity =
           local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_58._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d8.m_size = local_118.tail.m_size;
      local_d8.m_data = local_118.tail.m_data;
      eat_CWS(&local_d8);
      local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = (undefined1 *)qVar3;
      psStack_70 = local_f8.token.m_data;
      local_68 = (undefined1 *)qVar2;
      psStack_60 = local_118.token.m_data;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0xaaaaaaaaaaaaaa00;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      if ((undefined1 *)local_d8.m_size != (undefined1 *)0x0) {
        while (*local_d8.m_data == ';') {
          local_d8.m_data = local_d8.m_data + 1;
          local_d8.m_size = local_d8.m_size + -1;
          eat_CWS(&local_d8);
          psVar4 = local_d8.m_data;
          qVar3 = local_d8.m_size;
          data_00.m_data = local_d8.m_data;
          data_00.m_size = local_d8.m_size;
          local_a8.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_a8.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
          local_a8.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_a8.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
          parse_token(&local_a8,data_00);
          puVar8 = (undefined1 *)local_a8.token.m_size;
          if ((undefined1 *)local_a8.token.m_size == (undefined1 *)0x0) {
LAB_0022140a:
            local_148 = (char *)0x0;
            puVar8 = (undefined1 *)0x0;
            psVar6 = psVar4;
            pcVar7 = (char *)0x0;
            __n2 = (undefined1 *)0x0;
            puVar9 = (undefined1 *)qVar3;
          }
          else {
            local_88.m_size = local_a8.tail.m_size;
            local_88.m_data = local_a8.tail.m_data;
            eat_CWS(&local_88);
            if (((undefined1 *)local_88.m_size == (undefined1 *)0x0) || (*local_88.m_data != '='))
            goto LAB_0022140a;
            local_88.m_data = local_88.m_data + 1;
            local_88.m_size = local_88.m_size + -1;
            eat_CWS(&local_88);
            psVar6 = local_88.m_data;
            qVar2 = local_88.m_size;
            data_01.m_data = local_88.m_data;
            data_01.m_size = local_88.m_size;
            if (((undefined1 *)local_88.m_size != (undefined1 *)0x0) && (*local_88.m_data == '\"'))
            {
              local_148 = local_88.m_data;
              if (1 < local_88.m_size) {
                local_140 = (undefined1 *)0x1;
                do {
                  __n2 = local_140 + 1;
                  __c = psVar6[(long)local_140];
                  if (__c == '\\') {
                    if ((undefined1 *)qVar2 == __n2) break;
                    __c = psVar6[(long)(local_140 + 1)];
                    __n2 = local_140 + 2;
                  }
                  else if (__c == '\"') {
                    if (__n2 != (undefined1 *)0x0) {
                      psVar6 = psVar6 + (long)__n2;
                      pcVar7 = local_a8.token.m_data;
                      puVar9 = (undefined1 *)(qVar2 + -(long)__n2);
                      goto LAB_0022141d;
                    }
                    break;
                  }
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_replace_aux(&local_58,local_58._M_string_length,0,1,__c);
                  local_140 = __n2;
                } while ((long)__n2 < qVar2);
              }
              goto LAB_0022140a;
            }
            local_c8.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
            local_c8.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
            parse_token(&local_c8,data_01);
            psVar6 = local_c8.tail.m_data;
            pcVar7 = local_a8.token.m_data;
            __n2 = (undefined1 *)local_c8.token.m_size;
            puVar9 = (undefined1 *)local_c8.tail.m_size;
            local_148 = local_c8.token.m_data;
            if ((undefined1 *)local_c8.token.m_size == (undefined1 *)0x0) {
              local_148 = (char *)0x0;
              puVar8 = (undefined1 *)0x0;
              psVar6 = psVar4;
              pcVar7 = (char *)0x0;
              puVar9 = (undefined1 *)qVar3;
            }
          }
LAB_0022141d:
          QVar10.m_data = pcVar7;
          QVar10.m_size = (qsizetype)puVar8;
          QVar12.m_data = "charset";
          QVar12.m_size = 7;
          iVar5 = QtPrivate::compareStrings(QVar10,QVar12,CaseInsensitive);
          if (iVar5 == 0) {
            if ((local_58._M_string_length == 0) &&
               ((__n2 == (undefined1 *)0x0 || (*local_148 != '\"')))) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_58,0,0,local_148,(size_type)__n2);
            }
            break;
          }
          local_58._M_string_length = 0;
          *local_58._M_dataplus._M_p = '\0';
          if ((puVar9 == (undefined1 *)qVar3) ||
             (local_d8.m_size = (qsizetype)puVar9, local_d8.m_data = psVar6, eat_CWS(&local_d8),
             (undefined1 *)local_d8.m_size == (undefined1 *)0x0)) break;
        }
      }
      if ((local_78 != (undefined1 *)0x0) && (local_58._M_string_length != 0)) {
        QByteArray::QByteArray
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        goto LAB_002214e6;
      }
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = "UTF-8";
  (__return_storage_ptr__->d).size = 5;
LAB_002214e6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QRestReplyPrivate::contentCharset(const QNetworkReply* reply)
{
    // Content-type consists of mimetype and optional parameters, of which one may be 'charset'
    // Example values and their combinations below are all valid, see RFC 7231 section 3.1.1.5
    // and RFC 2045 section 5.1
    //
    // text/plain; charset=utf-8
    // text/plain; charset=utf-8;version=1.7
    // text/plain; charset = utf-8
    // text/plain; charset ="utf-8"

    const QByteArray contentTypeValue =
            reply->headers().value(QHttpHeaders::WellKnownHeader::ContentType).toByteArray();

    const auto r = parse_content_type(contentTypeValue);
    if (r && !r.charset.empty())
        return QByteArrayView(r.charset).toByteArray();
    else
        return "UTF-8"_ba; // Default to the most commonly used UTF-8.
}